

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  string *a;
  ostream *poVar1;
  string outpath;
  string binpath;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  if (this->TagType != SUBPROJECT) {
    a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                  (&this->LocalGenerator->super_cmLocalGenerator);
    local_80._M_dataplus._M_p._0_1_ = 0x2f;
    (*(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter
      [0x10])(&local_60,this->LocalGenerator,this->GeneratorTarget);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              (&local_40,a,(char *)&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    cmGeneratorTarget::GetDirectory(&local_80,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    cmSystemTools::RelativePath(&local_60,&local_40,&local_80);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    poVar1 = std::operator<<(fout,"    :binDirRelative=\"");
    poVar1 = std::operator<<(poVar1,(string *)&local_a0);
    poVar1 = std::operator<<(poVar1,"\"\n    -o \"");
    poVar1 = std::operator<<(poVar1,(string *)&this->TargetNameReal);
    std::operator<<(poVar1,"\"\n");
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::assign((char *)&local_a0);
  poVar1 = std::operator<<(fout,"    :outputDirRelative=\"");
  poVar1 = std::operator<<(poVar1,(string *)&local_a0);
  std::operator<<(poVar1,"\"\n");
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;

  /* Determine paths from the target project file to where the output artifacts
   * need to be located.
   */
  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    std::string binpath = cmStrCat(
      this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
    outpath = cmSystemTools::RelativePath(
      binpath, this->GeneratorTarget->GetDirectory(config));
    /* clang-format off */
    fout << "    :binDirRelative=\"" << outpath << "\"\n"
            "    -o \"" << this->TargetNameReal << "\"\n";
    /* clang-format on */
  }

  // set target object file destination
  outpath = ".";
  fout << "    :outputDirRelative=\"" << outpath << "\"\n";
}